

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O0

ktx_error_code_e ktxHashList_Serialize(ktxHashList *pHead,uint *pKvdLen,uchar **ppKvd)

{
  int iVar1;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined8 *in_RDI;
  undefined1 extraout_var [12];
  undefined1 auVar2 [16];
  undefined1 auVar5 [12];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar6;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  int padLen;
  char padding [4];
  uchar *sd;
  uint keyValueLen;
  uint bytesOfKeyValueData;
  ktxKVListEntry *kv;
  undefined1 local_3c [4];
  uint *local_38;
  uint local_30;
  uint local_2c;
  uint *local_28;
  undefined8 *local_20;
  uint *local_18;
  undefined8 *local_10;
  ktx_error_code_e local_4;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RSI == (uint *)0x0)) || (in_RDX == (undefined8 *)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_2c = 0;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    memset(local_3c,0,4);
    auVar5 = extraout_var;
    for (local_28 = (uint *)*local_10; local_28 != (uint *)0x0;
        local_28 = *(uint **)(local_28 + 0xc)) {
      auVar2._0_4_ = (float)(*local_28 + 4 + local_28[4]) * 0.25;
      auVar2._4_12_ = auVar5;
      auVar2 = roundss(auVar2,auVar2,10);
      in_XMM1_Db = 0;
      in_XMM1_Dc = 0;
      in_XMM1_Dd = 0;
      auVar5 = auVar2._4_12_;
      local_30 = (uint)(long)(auVar2._0_4_ * 4.0);
      local_2c = local_30 + local_2c;
    }
    if (local_2c == 0) {
      *local_18 = 0;
      *local_20 = 0;
    }
    else {
      local_38 = (uint *)malloc((ulong)local_2c);
      if (local_38 == (uint *)0x0) {
        return KTX_OUT_OF_MEMORY;
      }
      *local_18 = local_2c;
      *local_20 = local_38;
      for (local_28 = (uint *)*local_10; local_28 != (uint *)0x0;
          local_28 = *(uint **)(local_28 + 0xc)) {
        local_30 = *local_28 + local_28[4];
        *local_38 = local_30;
        local_38 = local_38 + 1;
        memcpy(local_38,*(void **)(local_28 + 2),(ulong)*local_28);
        local_38 = (uint *)((long)local_38 + (ulong)*local_28);
        if (local_28[4] != 0) {
          memcpy(local_38,*(void **)(local_28 + 6),(ulong)local_28[4]);
        }
        local_38 = (uint *)((long)local_38 + (ulong)local_28[4]);
        fVar6 = (float)local_30;
        auVar3._4_4_ = in_XMM1_Db;
        auVar3._0_4_ = fVar6;
        auVar3._8_4_ = in_XMM1_Dc;
        auVar3._12_4_ = in_XMM1_Dd;
        auVar4._4_12_ = auVar3._4_12_;
        auVar4._0_4_ = fVar6 * 0.25;
        auVar2 = roundss(auVar4,auVar4,10);
        iVar1 = (int)(long)(auVar2._0_4_ * 4.0 - fVar6);
        memcpy(local_38,local_3c,(long)iVar1);
        local_38 = (uint *)((long)local_38 + (long)iVar1);
      }
    }
    local_4 = KTX_SUCCESS;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxHashList_Serialize(ktxHashList* pHead,
                      unsigned int* pKvdLen, unsigned char** ppKvd)
{

    if (pHead && pKvdLen && ppKvd) {
        ktxKVListEntry* kv;
        unsigned int bytesOfKeyValueData = 0;
        unsigned int keyValueLen;
        unsigned char* sd;
        char padding[4] = {0, 0, 0, 0};

        for (kv = *pHead; kv != NULL; kv = kv->hh.next) {
            /* sizeof(sd) is to make space to write keyAndValueByteSize */
            keyValueLen = kv->keyLen + kv->valueLen + sizeof(ktx_uint32_t);
            /* Add valuePadding */
            keyValueLen = _KTX_PAD4(keyValueLen);
            bytesOfKeyValueData += keyValueLen;
        }

        if (bytesOfKeyValueData == 0) {
            *pKvdLen = 0;
            *ppKvd = NULL;
        } else {
            sd = malloc(bytesOfKeyValueData);
            if (!sd)
                return KTX_OUT_OF_MEMORY;

            *pKvdLen = bytesOfKeyValueData;
            *ppKvd = sd;

            for (kv = *pHead; kv != NULL; kv = kv->hh.next) {
                int padLen;

                keyValueLen = kv->keyLen + kv->valueLen;
                *(ktx_uint32_t*)sd = keyValueLen;
                sd += sizeof(ktx_uint32_t);
                memcpy(sd, kv->key, kv->keyLen);
                sd += kv->keyLen;
                if (kv->valueLen > 0)
                    memcpy(sd, kv->value, kv->valueLen);
                sd += kv->valueLen;
                padLen = _KTX_PAD4_LEN(keyValueLen);
                memcpy(sd, padding, padLen);
                sd += padLen;
            }
        }
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}